

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O0

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_f8 [4];
  int r;
  uv_pipe_t server;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,local_f8,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x52,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind(local_f8,"/path/to/unix/socket/that/really/should/not/be/there");
  if ((long)iVar1 != -0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x55,"r","==","UV_EACCES",(long)iVar1,"==",0xfffffffffffffff3);
    abort();
  }
  uv_close(local_f8,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x5b,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x5d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT_EQ(r, UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}